

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraEclipseCDT4Generator.cxx
# Opt level: O0

void cmExtraEclipseCDT4Generator::AddEnvVar(ostream *out,char *envVar,cmLocalGenerator *lg)

{
  undefined8 uVar1;
  bool bVar2;
  cmState *this;
  char *pcVar3;
  char *pcVar4;
  cmake *pcVar5;
  long lVar6;
  ulong uVar7;
  ostream *poVar8;
  allocator local_f9;
  string local_f8;
  allocator local_d1;
  string local_d0;
  string local_b0 [8];
  string valueToUse;
  char *cacheValue;
  undefined1 local_80 [8];
  string cacheEntryName;
  undefined1 local_48 [7];
  bool envVarSet;
  string envVarValue;
  cmMakefile *mf;
  cmLocalGenerator *lg_local;
  char *envVar_local;
  ostream *out_local;
  
  envVarValue.field_2._8_8_ = cmLocalGenerator::GetMakefile(lg);
  std::__cxx11::string::string((string *)local_48);
  bVar2 = cmsys::SystemTools::GetEnv(envVar,(string *)local_48);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)local_80,"CMAKE_ECLIPSE_ENVVAR_",(allocator *)((long)&cacheValue + 7));
  std::allocator<char>::~allocator((allocator<char> *)((long)&cacheValue + 7));
  std::__cxx11::string::operator+=((string *)local_80,envVar);
  this = cmLocalGenerator::GetState(lg);
  valueToUse.field_2._8_8_ = cmState::GetInitializedCacheValue(this,(string *)local_80);
  std::__cxx11::string::string(local_b0);
  if ((bVar2) || (valueToUse.field_2._8_8_ != 0)) {
    if ((bVar2) && (valueToUse.field_2._8_8_ == 0)) {
      std::__cxx11::string::operator=(local_b0,(string *)local_48);
      uVar1 = envVarValue.field_2._8_8_;
      pcVar3 = (char *)std::__cxx11::string::c_str();
      pcVar4 = (char *)std::__cxx11::string::c_str();
      cmMakefile::AddCacheDefinition
                ((cmMakefile *)uVar1,(string *)local_80,pcVar3,pcVar4,STRING,true);
      pcVar5 = cmMakefile::GetCMakeInstance((cmMakefile *)envVarValue.field_2._8_8_);
      pcVar3 = cmLocalGenerator::GetBinaryDirectory(lg);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_d0,pcVar3,&local_d1);
      cmake::SaveCache(pcVar5,&local_d0);
      std::__cxx11::string::~string((string *)&local_d0);
      std::allocator<char>::~allocator((allocator<char> *)&local_d1);
    }
    else if ((bVar2) || (valueToUse.field_2._8_8_ == 0)) {
      std::__cxx11::string::operator=(local_b0,(char *)valueToUse.field_2._8_8_);
      lVar6 = std::__cxx11::string::find(local_b0,(ulong)local_48);
      if (lVar6 == -1) {
        std::__cxx11::string::operator=(local_b0,(string *)local_48);
        uVar1 = envVarValue.field_2._8_8_;
        pcVar3 = (char *)std::__cxx11::string::c_str();
        pcVar4 = (char *)std::__cxx11::string::c_str();
        cmMakefile::AddCacheDefinition
                  ((cmMakefile *)uVar1,(string *)local_80,pcVar3,pcVar4,STRING,true);
        pcVar5 = cmMakefile::GetCMakeInstance((cmMakefile *)envVarValue.field_2._8_8_);
        pcVar3 = cmLocalGenerator::GetBinaryDirectory(lg);
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_f8,pcVar3,&local_f9);
        cmake::SaveCache(pcVar5,&local_f8);
        std::__cxx11::string::~string((string *)&local_f8);
        std::allocator<char>::~allocator((allocator<char> *)&local_f9);
      }
    }
    else {
      std::__cxx11::string::operator=(local_b0,(char *)valueToUse.field_2._8_8_);
    }
  }
  else {
    std::__cxx11::string::operator=(local_b0,"");
  }
  uVar7 = std::__cxx11::string::empty();
  if ((uVar7 & 1) == 0) {
    poVar8 = std::operator<<(out,envVar);
    poVar8 = std::operator<<(poVar8,"=");
    poVar8 = std::operator<<(poVar8,local_b0);
    std::operator<<(poVar8,"|");
  }
  std::__cxx11::string::~string(local_b0);
  std::__cxx11::string::~string((string *)local_80);
  std::__cxx11::string::~string((string *)local_48);
  return;
}

Assistant:

void cmExtraEclipseCDT4Generator::AddEnvVar(std::ostream& out,
                                            const char* envVar,
                                            cmLocalGenerator* lg)
{
  cmMakefile* mf = lg->GetMakefile();

  // get the variables from the environment and from the cache and then
  // figure out which one to use:

  std::string envVarValue;
  const bool envVarSet = cmSystemTools::GetEnv(envVar, envVarValue);

  std::string cacheEntryName = "CMAKE_ECLIPSE_ENVVAR_";
  cacheEntryName += envVar;
  const char* cacheValue =
    lg->GetState()->GetInitializedCacheValue(cacheEntryName);

  // now we have both, decide which one to use
  std::string valueToUse;
  if (!envVarSet && cacheValue == CM_NULLPTR) {
    // nothing known, do nothing
    valueToUse = "";
  } else if (envVarSet && cacheValue == CM_NULLPTR) {
    // The variable is in the env, but not in the cache. Use it and put it
    // in the cache
    valueToUse = envVarValue;
    mf->AddCacheDefinition(cacheEntryName, valueToUse.c_str(),
                           cacheEntryName.c_str(), cmStateEnums::STRING, true);
    mf->GetCMakeInstance()->SaveCache(lg->GetBinaryDirectory());
  } else if (!envVarSet && cacheValue != CM_NULLPTR) {
    // It is already in the cache, but not in the env, so use it from the cache
    valueToUse = cacheValue;
  } else {
    // It is both in the cache and in the env.
    // Use the version from the env. except if the value from the env is
    // completely contained in the value from the cache (for the case that we
    // now have a PATH without MSVC dirs in the env. but had the full PATH with
    // all MSVC dirs during the cmake run which stored the var in the cache:
    valueToUse = cacheValue;
    if (valueToUse.find(envVarValue) == std::string::npos) {
      valueToUse = envVarValue;
      mf->AddCacheDefinition(cacheEntryName, valueToUse.c_str(),
                             cacheEntryName.c_str(), cmStateEnums::STRING,
                             true);
      mf->GetCMakeInstance()->SaveCache(lg->GetBinaryDirectory());
    }
  }

  if (!valueToUse.empty()) {
    out << envVar << "=" << valueToUse << "|";
  }
}